

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  void *pvVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  u32 uVar6;
  BtShared *pBVar7;
  PgHdr *pPVar8;
  uint *pCell;
  undefined4 uVar9;
  undefined8 uVar10;
  i64 iVar11;
  char cVar12;
  ushort uVar13;
  u16 uVar14;
  u16 uVar15;
  Pgno PVar16;
  int iVar17;
  Pgno PVar18;
  MemPage **ppMVar19;
  undefined1 *puVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  u8 uVar26;
  int iVar27;
  ulong uVar28;
  MemPage *pMVar29;
  uint uVar30;
  MemPage *pMVar31;
  uint uVar32;
  int iVar33;
  u16 *puVar34;
  u8 *puVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  u8 *puVar39;
  ulong uVar40;
  ulong uVar41;
  uint *puVar42;
  undefined4 *puVar43;
  MemPage *pMVar44;
  bool bVar45;
  int rc_1;
  int rc;
  int cntNew [5];
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  Pgno pgnoNew;
  Pgno aPgOrder [5];
  int cntOld [5];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  u8 *apDiv [2];
  Pgno local_274;
  MemPage *local_270;
  u16 *local_268;
  ulong local_260;
  MemPage *local_258;
  BtCursor *local_250;
  ulong local_248;
  ulong local_240;
  MemPage *local_238;
  undefined1 *local_230;
  uint local_224;
  ulong local_220;
  ulong local_218;
  BtShared *local_210;
  ulong local_208;
  MemPage *local_200;
  undefined1 local_1f8 [32];
  undefined8 local_1d8;
  undefined8 local_1c0;
  uint local_1b8 [7];
  uint local_19c [7];
  u16 *local_180;
  undefined4 local_178;
  undefined1 local_174;
  ulong local_170;
  void *local_168;
  uint local_160;
  uint local_15c;
  MemPage *local_158;
  void *local_150;
  MemPage *local_148 [6];
  MemPage **local_118;
  ulong local_110;
  ulong local_108;
  CellInfo local_100;
  Pgno PStack_e8;
  uint local_e4 [7];
  uint auStack_c8 [6];
  ulong local_b0;
  long local_a8;
  long local_a0;
  uint *local_98;
  ulong local_90;
  MemPage **local_88;
  u16 auStack_80 [5];
  u8 local_75 [4];
  u8 auStack_71 [9];
  Pgno aPStack_68 [6];
  undefined1 local_50 [8];
  undefined8 auStack_48 [3];
  
  local_90 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  local_88 = pCur->apPage;
  local_118 = pCur->apPage + 1;
  local_150 = (void *)0x0;
  local_250 = pCur;
LAB_00138180:
  lVar38 = (long)pCur->iPage;
  pMVar29 = pCur->pPage;
  if (lVar38 == 0) {
    if (pMVar29->nOverflow == '\0') goto LAB_001383bf;
    local_148[0] = (MemPage *)0x0;
    local_1d8._0_4_ = 0;
    pBVar7 = pMVar29->pBt;
    iVar27 = sqlite3PagerWrite(pMVar29->pDbPage);
    local_1f8._0_4_ = iVar27;
    if (iVar27 == 0) {
      iVar27 = allocateBtreePage(pBVar7,local_148,(Pgno *)&local_1d8,pMVar29->pgno,'\0');
      local_1f8._0_4_ = iVar27;
      copyNodeContent(pMVar29,local_148[0],(int *)local_1f8);
      if (pBVar7->autoVacuum != '\0') {
        ptrmapPut(pBVar7,(Pgno)local_1d8,'\x05',pMVar29->pgno,(int *)local_1f8);
      }
    }
    pMVar31 = local_148[0];
    PVar16 = local_1f8._0_4_;
    if (local_1f8._0_4_ == 0) {
      memcpy(local_148[0]->aiOvfl,pMVar29->aiOvfl,(ulong)((uint)pMVar29->nOverflow * 2));
      memcpy(pMVar31->apOvfl,pMVar29->apOvfl,(ulong)pMVar29->nOverflow << 3);
      pMVar31->nOverflow = pMVar29->nOverflow;
      zeroPage(pMVar29,*pMVar31->aData & 0xfffffff7);
      *(Pgno *)(pMVar29->aData + (ulong)pMVar29->hdrOffset + 8) =
           (Pgno)local_1d8 >> 0x18 | ((Pgno)local_1d8 & 0xff0000) >> 8 |
           ((Pgno)local_1d8 & 0xff00) << 8 | (Pgno)local_1d8 << 0x18;
      *local_118 = pMVar31;
      PVar16 = 0;
    }
    else {
      *local_118 = (MemPage *)0x0;
      if (local_148[0] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_148[0]->pDbPage);
      }
    }
    bVar45 = true;
    if (PVar16 != 0) goto LAB_00138613;
    pCur->iPage = '\x01';
    pCur->ix = 0;
    pCur->aiIdx[0] = 0;
    pCur->apPage[0] = pMVar29;
    PVar16 = 0;
    ppMVar19 = local_118;
    goto LAB_00138607;
  }
  if ((pMVar29->nOverflow != '\0') || ((uint)local_90 < pMVar29->nFree)) {
    pMVar31 = pCur->apPage[lVar38 + -1];
    uVar13 = pCur->aiIdx[lVar38 + -1];
    PVar16 = sqlite3PagerWrite(pMVar31->pDbPage);
    if (PVar16 == 0) {
      local_258 = pMVar29;
      local_200 = pMVar31;
      if ((((pMVar29->intKeyLeaf != '\0') && (pMVar29->nOverflow == '\x01')) &&
          (pMVar29->aiOvfl[0] == pMVar29->nCell)) &&
         ((pMVar31->pgno != 1 && (pMVar31->nCell == uVar13)))) {
        if (pMVar29->nCell == 0) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11161);
          PVar16 = 0xb;
        }
        else {
          pBVar7 = pMVar29->pBt;
          local_1d8._0_4_ = allocateBtreePage(pBVar7,local_148,(Pgno *)&local_100,0,'\0');
          PVar16 = (Pgno)local_1d8;
          if ((Pgno)local_1d8 == 0) {
            puVar35 = pMVar29->apOvfl[0];
            local_1f8._0_8_ = puVar35;
            uVar15 = (*pMVar29->xCellSize)(pMVar29,puVar35);
            pMVar31 = local_148[0];
            local_1b8[0] = CONCAT22(local_1b8[0]._2_2_,uVar15);
            zeroPage(local_148[0],0xd);
            local_1d8._0_4_ = rebuildPage(pMVar31,1,(u8 **)local_1f8,(u16 *)local_1b8);
            pMVar29 = local_258;
            PVar16 = (Pgno)local_1d8;
            if ((Pgno)local_1d8 == 0) {
              pMVar31->nFree = ((short)pBVar7->usableSize - (pMVar31->cellOffset + uVar15)) - 2;
              if (pBVar7->autoVacuum != '\0') {
                ptrmapPut(pBVar7,(Pgno)local_100.nKey,'\x05',local_200->pgno,(int *)&local_1d8);
                if (pMVar31->minLocal < uVar15) {
                  ptrmapPutOvflPtr(pMVar31,puVar35,(int *)&local_1d8);
                }
              }
              pMVar44 = local_200;
              pMVar29 = local_258;
              uVar25 = 0;
              local_1f8._0_8_ =
                   local_258->aData +
                   (CONCAT11(local_258->aCellIdx[(ulong)local_258->nCell * 2 + -2],
                             local_258->aCellIdx[(ulong)local_258->nCell * 2 + -1]) &
                   local_258->maskPage);
              do {
                puVar35 = (u8 *)local_1f8._0_8_;
                local_1f8._0_8_ = puVar35 + 1;
                if (7 < uVar25) break;
                uVar25 = uVar25 + 1;
              } while ((char)*puVar35 < '\0');
              lVar38 = 4;
              do {
                uVar26 = *(u8 *)local_1f8._0_8_;
                local_1f8._0_8_ = local_1f8._0_8_ + 1;
                local_75[lVar38] = uVar26;
                lVar38 = lVar38 + 1;
                if (-1 < (char)uVar26) break;
              } while ((ulong)local_1f8._0_8_ < puVar35 + 10);
              if ((Pgno)local_1d8 == 0) {
                insertCell(local_200,(uint)local_200->nCell,local_75,(int)lVar38,(u8 *)0x0,
                           local_258->pgno,(int *)&local_1d8);
              }
              *(Pgno *)(pMVar44->aData + (ulong)pMVar44->hdrOffset + 8) =
                   (Pgno)local_100.nKey >> 0x18 | ((Pgno)local_100.nKey & 0xff0000) >> 8 |
                   ((Pgno)local_100.nKey & 0xff00) << 8 | (Pgno)local_100.nKey << 0x18;
              PVar16 = (Pgno)local_1d8;
              if (pMVar31 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar31->pDbPage);
                PVar16 = (Pgno)local_1d8;
              }
            }
          }
        }
        goto LAB_001385d8;
      }
      local_168 = pcache1Alloc(pCur->pBt->pageSize);
      local_274 = 0;
      local_178 = 0;
      local_174 = 0;
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
      local_1f8._16_8_ = (MemPage *)0x0;
      if (local_168 != (void *)0x0) {
        uVar32 = pCur->hints & 1;
        local_108 = (ulong)uVar32;
        uVar37 = (uint)pMVar31->nCell + (uint)pMVar31->nOverflow;
        local_170 = 0;
        if (1 < uVar37) {
          uVar30 = (uint)uVar13;
          if (uVar30 == 0) {
            local_170 = 0;
          }
          else if (uVar37 == uVar30) {
            local_170 = (ulong)((uVar37 + uVar32) - 2);
          }
          else {
            local_170 = (ulong)(uVar30 - 1);
          }
          uVar37 = 2 - uVar32;
        }
        uVar25 = (ulong)uVar37;
        uVar32 = ((int)local_170 - (uint)pMVar31->nOverflow) + uVar37;
        if (uVar32 == pMVar31->nCell) {
          uVar28 = (ulong)pMVar31->hdrOffset + 8;
        }
        else {
          uVar28 = (ulong)(CONCAT11(pMVar31->aCellIdx[(long)(int)uVar32 * 2],
                                    pMVar31->aCellIdx[(long)(int)uVar32 * 2 + 1]) &
                          pMVar31->maskPage);
        }
        local_98 = (uint *)(pMVar31->aData + uVar28);
        local_210 = pMVar31->pBt;
        uVar28 = (ulong)(uVar37 + 1);
        uVar32 = *local_98;
        local_224 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                    uVar32 << 0x18;
        local_260 = CONCAT44(local_260._4_4_,local_224);
        local_a0 = lVar38;
        local_274 = getAndInitPage(local_210,local_224,(MemPage **)(&local_1d8 + uVar25),
                                   (BtCursor *)0x0,0);
        local_248 = uVar28;
        if (local_274 == 0) {
          local_15c = uVar37 + 1;
          pMVar29 = (MemPage *)(&local_1d8)[uVar25];
          iVar27 = (uint)pMVar29->nCell + (uint)pMVar29->nOverflow + 1;
          local_208 = uVar25;
          local_110 = uVar25;
          if (uVar37 != 0) {
            pMVar29 = (MemPage *)(ulong)(((int)local_170 + uVar37) - 1);
            iVar36 = ((int)local_170 + uVar37) * 2;
            local_268 = (u16 *)(local_19c + uVar25);
            local_270 = (MemPage *)(ulong)(uVar37 * 8);
            local_230 = local_50 + (long)local_270;
            local_238 = (MemPage *)((long)local_270->aiOvfl + (long)(local_1f8 + -2));
            local_240 = -uVar25;
            lVar38 = 0;
            uVar25 = 0;
            local_158 = pMVar29;
            do {
              iVar36 = iVar36 + -2;
              iVar17 = (int)uVar25;
              if ((pMVar31->nOverflow == 0) || ((int)pMVar29 + iVar17 != (uint)pMVar31->aiOvfl[0]))
              {
                puVar39 = pMVar31->aData;
                lVar23 = (long)(int)(iVar36 + (uint)pMVar31->nOverflow * -2);
                uVar13 = CONCAT11(pMVar31->aCellIdx[lVar23],pMVar31->aCellIdx[lVar23 + 1]) &
                         pMVar31->maskPage;
                puVar35 = puVar39 + uVar13;
                *(u8 **)(local_230 + uVar25 * 8) = puVar35;
                uVar32 = *(uint *)(puVar39 + uVar13);
                local_260 = CONCAT44(local_260._4_4_,
                                     uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 |
                                     (uVar32 & 0xff00) << 8 | uVar32 << 0x18);
                uVar15 = (*pMVar31->xCellSize)(pMVar31,puVar35);
                uVar32 = (uint)uVar15;
                *(uint *)(local_268 + uVar25 * 2) = (uint)uVar15;
                if ((local_210->btsFlags & 0xc) != 0) {
                  iVar22 = (int)puVar35 - *(int *)&pMVar31->aData;
                  iVar33 = iVar22 + (uint)uVar15;
                  local_1c0 = CONCAT44(local_1c0._4_4_,iVar33);
                  local_220 = CONCAT44(local_220._4_4_,local_210->usableSize);
                  local_218 = (ulong)uVar15;
                  if ((int)local_210->usableSize < iVar33) {
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112b6);
                    local_274 = 0xb;
                    memset(&local_1d8,0,(long)local_270->aiOvfl + lVar38 + -0x1a);
                  }
                  else {
                    memcpy((void *)((long)iVar22 + (long)local_168),puVar35,(ulong)(uint)uVar15);
                    *(long *)(local_230 + uVar25 * 8) =
                         ((long)puVar35 - (long)pMVar31->aData) + (long)local_168;
                  }
                  uVar32 = (uint)local_218;
                  pMVar31 = local_200;
                  if ((int)local_220 < (int)local_1c0) {
                    local_224 = (Pgno)local_260;
                    goto LAB_00138fb9;
                  }
                }
                pMVar29 = local_158;
                dropCell(pMVar31,((int)local_158 + iVar17) - (uint)pMVar31->nOverflow,uVar32,
                         (int *)&local_274);
              }
              else {
                puVar42 = (uint *)pMVar31->apOvfl[0];
                *(uint **)(local_230 + uVar25 * 8) = puVar42;
                uVar32 = *puVar42;
                local_260 = CONCAT44(local_260._4_4_,
                                     uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 |
                                     (uVar32 & 0xff00) << 8 | uVar32 << 0x18);
                uVar15 = (*pMVar31->xCellSize)(pMVar31,(u8 *)puVar42);
                *(uint *)(local_268 + uVar25 * 2) = (uint)uVar15;
                pMVar31->nOverflow = '\0';
              }
              pMVar31 = local_238;
              local_274 = getAndInitPage(local_210,(Pgno)local_260,
                                         (MemPage **)((long)local_238->aiOvfl + lVar38 + -0x1a),
                                         (BtCursor *)0x0,0);
              if (local_274 != 0) {
                uVar37 = (iVar17 + (int)local_208) - 1;
                pMVar29 = local_258;
                goto LAB_00138521;
              }
              iVar27 = iVar27 + (uint)*(ushort *)
                                       (*(long *)(pMVar31->aiOvfl + uVar25 * 4 + -0xd) + 0x16) +
                       (uint)*(byte *)(*(long *)(pMVar31->aiOvfl + uVar25 * 4 + -0xd) + 0xc) + 1;
              uVar25 = uVar25 - 1;
              lVar38 = lVar38 + -8;
              pMVar31 = local_200;
            } while (local_240 != uVar25);
          }
          local_224 = (Pgno)local_260;
          uVar32 = iVar27 + 3U & 0xfffffffc;
          local_1f8._16_8_ = sqlite3Malloc((long)(int)(uVar32 * 10 + local_210->pageSize));
          if ((MemPage *)local_1f8._16_8_ == (MemPage *)0x0) {
            local_274 = 7;
LAB_00138fb9:
            local_270 = (MemPage *)0x0;
            uVar25 = local_248;
            pMVar29 = local_258;
            pCur = local_250;
            PVar18 = local_274;
            pMVar31 = local_270;
          }
          else {
            local_a8 = (long)(int)uVar32;
            local_268 = ((MemPage *)local_1f8._16_8_)->aiOvfl + local_a8 * 4 + -0xd;
            local_1f8._24_8_ = local_268;
            local_270 = (MemPage *)(local_268 + local_a8);
            local_1f8._8_8_ = CONCAT44(local_1d8._4_4_,(Pgno)local_1d8);
            local_160 = (uint)((MemPage *)local_1f8._8_8_)->leaf;
            local_220 = (ulong)((MemPage *)local_1f8._8_8_)->leaf << 2;
            local_158 = (MemPage *)local_1f8._8_8_;
            local_230 = (undefined1 *)(ulong)((MemPage *)local_1f8._8_8_)->intKeyLeaf;
            local_180 = ((MemPage *)local_1f8._16_8_)->aiOvfl + local_a8 * 5 + -0xd;
            uVar28 = 0;
            iVar27 = 0;
            uVar32 = 0;
            local_238 = (MemPage *)local_1f8._16_8_;
            do {
              lVar38 = (&local_1d8)[uVar28];
              puVar35 = *(u8 **)(lVar38 + 0x50);
              uVar26 = *puVar35;
              local_260 = CONCAT71(local_260._1_7_,*local_158->aData);
              if (uVar26 == *local_158->aData) {
                local_218 = CONCAT71(local_218._1_7_,uVar26);
                uVar13 = *(ushort *)(lVar38 + 0x18);
                puVar39 = puVar35 + *(ushort *)(lVar38 + 0x12);
                local_1c0 = (ulong)(int)uVar32;
                local_240 = uVar28;
                memset(local_268 + local_1c0,0,
                       (ulong)(((uint)*(byte *)(lVar38 + 0xc) + (uint)*(ushort *)(lVar38 + 0x16)) *
                              2));
                puVar34 = local_268;
                bVar3 = *(byte *)(lVar38 + 0xc);
                if (bVar3 != 0) {
                  uVar4 = *(ushort *)(lVar38 + 0x1a);
                  if (uVar4 != 0) {
                    lVar23 = 0;
                    do {
                      *(u8 **)(local_238->aiOvfl + local_1c0 * 4 + lVar23 * 4 + -0xd) =
                           puVar35 + (uVar13 & CONCAT11(*puVar39,puVar39[1]));
                      puVar39 = puVar39 + 2;
                      lVar23 = lVar23 + 1;
                    } while ((uint)uVar4 != (uint)lVar23);
                    uVar32 = uVar32 + (uint)lVar23;
                  }
                  uVar37 = (uint)bVar3;
                  if (bVar3 < 2) {
                    uVar37 = 1;
                  }
                  uVar25 = 0;
                  do {
                    *(undefined8 *)(local_238->aiOvfl + (long)(int)uVar32 * 4 + uVar25 * 4 + -0xd) =
                         *(undefined8 *)(lVar38 + 0x28 + uVar25 * 8);
                    uVar25 = uVar25 + 1;
                  } while (uVar37 != uVar25);
                  uVar32 = uVar32 + (int)uVar25;
                  local_1f8._0_8_ = CONCAT44(SUB84(local_1f8._0_8_,4),uVar32);
                }
                uVar4 = *(ushort *)(lVar38 + 0x12);
                uVar5 = *(ushort *)(lVar38 + 0x16);
                if (puVar39 < puVar35 + (ulong)uVar5 * 2 + (ulong)uVar4) {
                  lVar23 = (long)(int)uVar32;
                  lVar24 = 0;
                  do {
                    puVar1 = puVar39 + lVar24;
                    *(u8 **)(local_238->aiOvfl + lVar23 * 4 + lVar24 * 2 + -0xd) =
                         puVar35 + (CONCAT11(*puVar1,puVar1[1]) & uVar13);
                    uVar32 = uVar32 + 1;
                    local_1f8._0_4_ = uVar32;
                    lVar24 = lVar24 + 2;
                  } while (puVar1 + 2 < puVar35 + (ulong)uVar5 * 2 + (ulong)uVar4);
                }
                auStack_c8[local_240] = uVar32;
                if ((local_208 <= local_240) || ((char)local_230 != '\0')) {
                  uVar28 = local_240;
                  uVar26 = (u8)local_218;
                  goto LAB_00138baf;
                }
                uVar37 = local_19c[local_240 + 1] & 0xffff;
                lVar23 = (long)(int)uVar32;
                local_268[lVar23] = (u16)local_19c[local_240 + 1];
                pvVar2 = (void *)((long)local_270 + (long)iVar27);
                iVar27 = iVar27 + uVar37;
                memcpy(pvVar2,(void *)auStack_48[local_240],(ulong)uVar37);
                puVar43 = (undefined4 *)((long)pvVar2 + local_220);
                *(undefined4 **)(local_238->aiOvfl + lVar23 * 4 + -0xd) = puVar43;
                uVar13 = puVar34[lVar23] - (short)local_220;
                puVar34[lVar23] = uVar13;
                if (*(char *)(lVar38 + 8) == '\0') {
                  *puVar43 = *(undefined4 *)(*(long *)(lVar38 + 0x50) + 8);
                }
                else if (uVar13 < 4) {
                  puVar20 = (undefined1 *)((long)iVar27 + (long)local_180);
                  do {
                    *puVar20 = 0;
                    uVar15 = puVar34[lVar23];
                    puVar34[lVar23] = uVar15 + 1;
                    puVar20 = puVar20 + 1;
                    iVar27 = iVar27 + 1;
                  } while ((ushort)(uVar15 + 1) < 4);
                }
                uVar32 = uVar32 + 1;
                local_1f8._0_4_ = uVar32;
                uVar28 = local_240;
                uVar26 = (u8)local_218;
              }
              else {
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x112f7);
                local_274 = 0xb;
LAB_00138baf:
              }
              uVar25 = local_248;
              if (uVar26 != (u8)local_260) {
                local_270 = (MemPage *)0x0;
                pMVar29 = local_258;
                pCur = local_250;
                PVar18 = local_274;
                pMVar31 = local_270;
                goto LAB_00138551;
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != local_248);
            local_270 = (MemPage *)0x0;
            local_b0 = local_220 & 0xffff;
            local_260 = CONCAT44(local_260._4_4_,
                                 local_210->usableSize + (uint)(ushort)local_220 + -0xc);
            uVar28 = 0;
            do {
              lVar38 = (&local_1d8)[uVar28];
              local_19c[uVar28 + 1] = (Pgno)local_260 - *(ushort *)(lVar38 + 0x14);
              if (*(char *)(lVar38 + 0xc) != '\0') {
                uVar40 = 0;
                do {
                  uVar13 = (**(code **)(lVar38 + 0x78))
                                     (lVar38,*(undefined8 *)(lVar38 + 0x28 + uVar40 * 8));
                  local_19c[uVar28 + 1] = (uint)uVar13 + local_19c[uVar28 + 1] + 2;
                  uVar40 = uVar40 + 1;
                } while (uVar40 < *(byte *)(lVar38 + 0xc));
              }
              local_1b8[uVar28] = auStack_c8[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar25);
            local_180 = (u16 *)CONCAT44(local_180._4_4_,local_274);
            local_240 = CONCAT44(local_240._4_4_,local_1f8._0_4_);
            local_218 = (ulong)(int)local_1f8._0_4_;
            local_1c0 = -local_218;
            uVar40 = 0;
            uVar28 = (ulong)local_15c;
            puVar34 = local_268;
            do {
              uVar32 = local_19c[uVar40 + 1];
              if ((int)(Pgno)local_260 < (int)uVar32) {
                local_220 = CONCAT44(local_220._4_4_,(int)uVar40 + 2);
                do {
                  if ((long)(int)uVar28 <= (long)(uVar40 + 1)) {
                    if (3 < uVar40) {
                      local_19c[uVar40 + 1] = uVar32;
                      bVar45 = false;
                      local_180 = (u16 *)CONCAT44(local_180._4_4_,0xb);
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11364,
                                  "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9"
                                 );
                      puVar34 = local_268;
                      uVar28 = local_220 & 0xffffffff;
                      pCur = local_250;
                      goto LAB_00138ec3;
                    }
                    local_19c[uVar40 + 2] = 0;
                    local_1b8[uVar40 + 1] = (uint)local_240;
                    uVar28 = local_220 & 0xffffffff;
                  }
                  uVar37 = local_1b8[uVar40];
                  uVar15 = puVar34[(long)(int)uVar37 + -1];
                  if (uVar15 == 0) {
                    uVar15 = computeCellSize((CellArray *)local_1f8,uVar37 - 1);
                    puVar34 = local_268;
                  }
                  iVar27 = uVar15 + 2;
                  if ((int)local_230 == 0) {
                    iVar27 = 0;
                    if ((int)uVar37 < (int)(uint)local_240) {
                      uVar14 = puVar34[(int)uVar37];
                      if (uVar14 == 0) {
                        uVar14 = computeCellSize((CellArray *)local_1f8,uVar37);
                        puVar34 = local_268;
                      }
                      iVar27 = uVar14 + 2;
                    }
                  }
                  local_19c[uVar40 + 2] = local_19c[uVar40 + 2] + iVar27;
                  uVar32 = uVar32 - (uVar15 + 2);
                  local_1b8[uVar40] = uVar37 - 1;
                  uVar25 = local_248;
                } while ((int)(Pgno)local_260 < (int)uVar32);
              }
              pCur = local_250;
              local_19c[uVar40 + 1] = uVar32;
              uVar32 = local_1b8[uVar40];
              if ((int)uVar32 < (int)(uint)local_240) {
                bVar45 = true;
                local_220 = uVar28;
                lVar38 = (long)(int)uVar32;
                do {
                  lVar23 = lVar38 + 1;
                  uVar15 = puVar34[lVar38];
                  if (uVar15 == 0) {
                    uVar15 = computeCellSize((CellArray *)local_1f8,uVar32);
                    puVar34 = local_268;
                    uVar28 = local_220;
                  }
                  iVar27 = uVar15 + 2;
                  if ((int)(Pgno)local_260 < (int)(local_19c[uVar40 + 1] + iVar27)) {
                    if (bVar45) {
                      if (uVar40 == 0) {
                        iVar27 = 0;
                      }
                      else {
                        iVar27 = *(int *)((long)&local_1c0 + uVar40 * 4 + 4);
                      }
                      bVar45 = true;
                      uVar25 = local_248;
                      if ((int)uVar32 <= iVar27) {
                        bVar45 = false;
                        local_180 = (u16 *)CONCAT44(local_180._4_4_,0xb);
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11385,
                                    "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9"
                                   );
                        uVar25 = local_248;
                        puVar34 = local_268;
                        uVar28 = local_220;
                      }
                      goto LAB_00138ec3;
                    }
                    break;
                  }
                  local_19c[uVar40 + 1] = local_19c[uVar40 + 1] + iVar27;
                  local_1b8[uVar40] = uVar32 + 1;
                  if (((int)local_230 == 0) && (iVar27 = 0, lVar23 < (long)local_218)) {
                    uVar15 = puVar34[lVar23];
                    if (uVar15 == 0) {
                      uVar15 = computeCellSize((CellArray *)local_1f8,uVar32 + 1);
                      puVar34 = local_268;
                      uVar28 = local_220;
                    }
                    iVar27 = uVar15 + 2;
                  }
                  local_19c[uVar40 + 2] = local_19c[uVar40 + 2] - iVar27;
                  bVar45 = lVar23 < (long)local_218;
                  uVar32 = uVar32 + 1;
                  lVar38 = lVar23;
                } while (local_1c0 + lVar23 != 0);
              }
              bVar45 = true;
              uVar25 = local_248;
              uVar28 = (ulong)((int)uVar40 + 1);
LAB_00138ec3:
              if (!bVar45) {
                local_274 = (Pgno)local_180;
                pMVar29 = local_258;
                PVar18 = local_274;
                pMVar31 = local_270;
                goto LAB_00138551;
              }
              uVar40 = uVar40 + 1;
            } while ((long)uVar40 < (long)(int)uVar28);
            local_274 = (Pgno)local_180;
            local_1c0 = (ulong)((int)uVar28 - 1);
            local_238 = (MemPage *)
                        ((long)local_238 + (local_a8 * 8 - (ulong)(uint)((int)local_230 * 2)));
            uVar40 = local_1c0;
            local_220 = uVar28;
            do {
              if ((int)uVar40 < 1) {
                local_268 = (u16 *)CONCAT44(local_268._4_4_,(uint)*local_158->aData);
                pCur = local_250;
                uVar40 = local_208;
                if ((int)uVar28 < 1) {
                  pMVar31 = (MemPage *)0x0;
                  goto LAB_0013939c;
                }
                uVar41 = 0;
                pMVar31 = (MemPage *)0x0;
                goto LAB_001391f3;
              }
              uVar32 = local_19c[uVar40];
              uVar37 = local_19c[uVar40 + 1];
              uVar30 = *(uint *)((long)&local_1c0 + uVar40 * 4 + 4);
              lVar38 = (long)(int)uVar30 - ((ulong)local_230 & 0xffffffff);
              if (puVar34[lVar38] == 0) {
                computeCellSize((CellArray *)local_1f8,(int)lVar38);
                puVar34 = local_268;
                uVar28 = local_220;
              }
              bVar45 = uVar40 == local_1c0;
              lVar38 = (long)(int)uVar30 + 1;
              local_218 = uVar40;
              do {
                uVar30 = uVar30 - 1;
                if (puVar34[lVar38 + -2] == 0) {
                  computeCellSize((CellArray *)local_1f8,uVar30);
                  puVar34 = local_268;
                  uVar28 = local_220;
                }
                uVar25 = local_248;
                if ((uVar37 != 0) &&
                   (((char)local_108 != '\0' ||
                    ((int)((uVar32 + (uint)bVar45 * 2 + -2) - (uint)puVar34[lVar38 + -2]) <
                     (int)(local_238->aiOvfl[lVar38 + -0xe] + uVar37 + 2))))) break;
                uVar37 = uVar37 + local_238->aiOvfl[lVar38 + -0xe] + 2;
                uVar32 = (uVar32 - puVar34[lVar38 + -2]) - 2;
                local_1b8[uVar40 - 1] = uVar30;
                lVar38 = lVar38 + -1;
              } while (1 < lVar38);
              local_19c[local_218 + 1] = uVar37;
              local_19c[uVar40] = uVar32;
              lVar38 = uVar40 - 1;
              uVar32 = 0;
              if (local_218 != 1) {
                uVar32 = local_1b8[(int)local_218 - 2];
              }
              uVar40 = uVar40 - 1;
            } while ((int)uVar32 < (int)local_1b8[lVar38]);
            local_270 = (MemPage *)0x0;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x113af);
            local_274 = 0xb;
            pMVar29 = local_258;
            pCur = local_250;
            PVar18 = local_274;
            pMVar31 = local_270;
          }
        }
        else {
LAB_00138521:
          pCur = local_250;
          local_224 = (Pgno)local_260;
          local_270 = (MemPage *)0x0;
          memset(&local_1d8,0,(long)(int)uVar37 * 8 + 8);
          uVar25 = local_248;
          PVar18 = local_274;
          pMVar31 = local_270;
        }
        goto LAB_00138551;
      }
      PVar16 = 7;
      goto LAB_001385b6;
    }
    goto LAB_001385d8;
  }
LAB_001383bf:
  bVar45 = false;
  PVar16 = 0;
  goto LAB_00138613;
  while (uVar41 = uVar41 + 1, (uVar28 & 0xffffffff) != uVar41) {
LAB_001391f3:
    pBVar7 = local_210;
    if (uVar40 < uVar41) {
      PVar16 = 1;
      if ((char)local_108 == '\0') {
        PVar16 = local_224;
      }
      bVar45 = false;
      local_274 = allocateBtreePage(local_210,(MemPage **)&local_100,&local_224,PVar16,'\0');
      iVar11 = local_100.nKey;
      uVar40 = local_208;
      if (local_274 == 0) {
        zeroPage((MemPage *)local_100.nKey,(int)local_268);
        local_148[uVar41] = (MemPage *)iVar11;
        pMVar31 = (MemPage *)(ulong)((int)pMVar31 + 1);
        auStack_c8[uVar41] = (uint)local_240;
        uVar40 = local_208;
        pCur = local_250;
        if ((pBVar7->autoVacuum == '\0') ||
           (ptrmapPut(pBVar7,*(Pgno *)(iVar11 + 4),'\x05',local_200->pgno,(int *)&local_274),
           uVar40 = local_208, pCur = local_250, local_274 == 0)) goto LAB_00139304;
        bVar45 = false;
      }
    }
    else {
      pMVar29 = (MemPage *)(&local_1d8)[uVar41];
      local_148[uVar41] = pMVar29;
      local_100.nKey = (i64)pMVar29;
      (&local_1d8)[uVar41] = 0;
      local_274 = sqlite3PagerWrite(pMVar29->pDbPage);
      pMVar31 = (MemPage *)(ulong)((int)pMVar31 + 1);
      if (local_274 == 0) {
LAB_00139304:
        bVar45 = true;
      }
      else {
        bVar45 = false;
      }
    }
    uVar25 = local_248;
    pMVar29 = local_258;
    PVar18 = local_274;
    if (!bVar45) goto LAB_00138551;
  }
LAB_0013939c:
  local_270 = pMVar31;
  if (0 < (int)pMVar31) {
    lVar38 = 0;
    do {
      pMVar29 = local_148[lVar38];
      PVar16 = pMVar29->pgno;
      aPStack_68[lVar38] = PVar16;
      (&PStack_e8)[lVar38] = PVar16;
      auStack_80[lVar38] = pMVar29->pDbPage->flags;
      if (lVar38 != 0) {
        lVar23 = 0;
        do {
          if (aPStack_68[lVar23] == PVar16) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x113f9);
            local_274 = 0xb;
            pMVar29 = local_258;
            PVar18 = local_274;
            pMVar31 = local_270;
            goto LAB_00138551;
          }
          lVar23 = lVar23 + 1;
        } while (lVar38 != lVar23);
      }
      lVar38 = lVar38 + 1;
    } while ((MemPage *)lVar38 != pMVar31);
  }
  pMVar44 = pMVar31;
  PVar16 = local_224;
  if (0 < (int)pMVar31) {
    uVar25 = 0;
    do {
      uVar28 = 0;
      if ((int)local_270 != 1) {
        uVar21 = 1;
        uVar41 = 0;
        do {
          uVar28 = uVar21 & 0xffffffff;
          if ((&PStack_e8)[(int)uVar41] <= (&PStack_e8)[uVar21]) {
            uVar28 = uVar41;
          }
          uVar21 = uVar21 + 1;
          uVar41 = uVar28;
        } while (pMVar31 != (MemPage *)uVar21);
      }
      pMVar44 = (MemPage *)(long)(int)uVar28;
      PVar16 = (&PStack_e8)[(long)pMVar44];
      (&PStack_e8)[(long)pMVar44] = 0xffffffff;
      if (uVar25 != uVar28) {
        if ((long)uVar25 < (long)pMVar44) {
          pPVar8 = local_148[(long)pMVar44]->pDbPage;
          uVar6 = local_210->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)uVar28 + uVar6 + 1);
        }
        pMVar29 = local_148[uVar25];
        pPVar8 = pMVar29->pDbPage;
        pPVar8->flags = auStack_80[(long)pMVar44];
        sqlite3PcacheMove(pPVar8,PVar16);
        pMVar29->pgno = PVar16;
      }
      uVar25 = uVar25 + 1;
    } while ((MemPage *)uVar25 != pMVar31);
  }
  uVar37 = (uint)local_270;
  local_218 = (ulong)(int)uVar37;
  pvVar2 = (&local_150)[local_218];
  uVar32 = *(uint *)((long)pvVar2 + 4);
  *local_98 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 | uVar32 << 0x18;
  if ((((ulong)local_268 & 8) == 0) && (local_15c != uVar37)) {
    ppMVar19 = (MemPage **)&local_1d8;
    if ((int)local_15c < (int)uVar37) {
      ppMVar19 = local_148;
    }
    *(undefined4 *)(*(long *)((long)pvVar2 + 0x50) + 8) =
         *(undefined4 *)(ppMVar19[uVar40]->aData + 8);
  }
  uVar32 = (uint)local_170;
  local_224 = PVar16;
  if (local_210->autoVacuum == '\0') {
LAB_00139896:
    uVar10 = local_1f8._16_8_;
    if (1 < (int)local_270) {
      local_268 = (u16 *)local_1f8._24_8_;
      local_238 = (MemPage *)(ulong)((int)local_270 - 1);
      uVar28 = (ulong)uVar32;
      pMVar44 = (MemPage *)0x0;
      iVar27 = 0;
      local_240 = uVar28;
      do {
        pMVar29 = local_148[(long)pMVar44];
        lVar38 = (long)(int)local_1b8[(long)pMVar44];
        puVar35 = *(u8 **)((u16 *)(uVar10 + 0x1a) + lVar38 * 4 + -0xd);
        uVar32 = (uint)local_268[lVar38] + (int)local_b0;
        puVar39 = (u8 *)((long)iVar27 + (long)local_168);
        if (pMVar29->leaf == '\0') {
          *(undefined4 *)(pMVar29->aData + 8) = *(undefined4 *)puVar35;
        }
        else if ((int)local_230 == 0) {
          puVar35 = puVar35 + -4;
          if (local_268[lVar38] == 4) {
            uVar15 = (*local_200->xCellSize)(local_200,puVar35);
            uVar32 = (uint)uVar15;
            uVar28 = local_240;
          }
        }
        else {
          (*pMVar29->xParseCell)
                    (pMVar29,*(u8 **)((u16 *)(uVar10 + 0x1a) + lVar38 * 4 + -0x11),&local_100);
          iVar36 = sqlite3PutVarint(puVar39 + 4,local_100.nKey);
          uVar32 = iVar36 + 4;
          puVar35 = puVar39;
          puVar39 = (u8 *)0x0;
        }
        insertCell(local_200,(int)pMVar44 + (int)uVar28,puVar35,uVar32,puVar39,pMVar29->pgno,
                   (int *)&local_274);
        uVar25 = local_248;
        pMVar29 = local_258;
        pCur = local_250;
        PVar18 = local_274;
        pMVar31 = local_270;
        if (local_274 != 0) goto LAB_00138551;
        iVar27 = iVar27 + uVar32;
        pMVar44 = (MemPage *)((long)pMVar44 + 1);
      } while (local_238 != pMVar44);
    }
    iVar27 = (int)local_270;
    uVar32 = 1 - iVar27;
    PVar18 = local_274;
    if ((int)uVar32 < iVar27) {
      bVar45 = (int)local_230 == 0;
      uVar9 = local_1f8._0_4_;
      local_230 = (undefined1 *)CONCAT44(local_230._4_4_,local_1b8[0]);
      iVar27 = iVar27 * 2 + -1;
      do {
        uVar37 = -uVar32;
        if (0 < (int)uVar32) {
          uVar37 = uVar32;
        }
        uVar25 = (ulong)uVar37;
        iVar17 = 0x3b;
        if ((*(char *)((long)&local_178 + uVar25) == '\0') &&
           ((-1 < (int)uVar32 ||
            (iVar17 = 0,
            *(int *)((long)&local_1c0 + (long)(int)uVar37 * 4 + 4) <=
            (int)auStack_c8[(long)(int)uVar37 + -1])))) {
          if (uVar32 == 0) {
            iVar22 = 0;
            iVar36 = 0;
            iVar17 = (int)local_230;
          }
          else {
            iVar36 = uVar9;
            if (uVar37 <= (uint)local_110) {
              iVar36 = auStack_c8[(long)(int)uVar37 + -1] + (uint)bVar45;
            }
            iVar22 = *(int *)((long)&local_1c0 + (long)(int)uVar37 * 4 + 4) + (uint)bVar45;
            iVar17 = local_1b8[uVar25] - iVar22;
          }
          pMVar44 = local_148[uVar25];
          PVar18 = editPage(pMVar44,iVar36,iVar22,iVar17,(CellArray *)local_1f8);
          iVar17 = 4;
          if (PVar18 == 0) {
            *(undefined1 *)((long)&local_178 + uVar25) = 1;
            pMVar44->nFree = (short)local_260 - (short)local_19c[uVar25 + 1];
            iVar17 = 0;
          }
        }
        PVar16 = (Pgno)pMVar44;
        if ((iVar17 != 0) && (pMVar29 = local_258, pCur = local_250, iVar17 != 0x3b))
        goto joined_r0x00139bc8;
        uVar32 = uVar32 + 1;
        iVar27 = iVar27 + -1;
      } while (iVar27 != 0);
    }
    pMVar44 = local_148[0];
    pMVar31 = local_200;
    pBVar7 = local_210;
    uVar25 = local_248;
    pCur = local_250;
    pMVar29 = local_258;
    local_274 = PVar18;
    if ((((char)local_a0 == '\x01') && (local_200->nCell == 0)) &&
       ((ushort)local_200->hdrOffset <= local_148[0]->nFree)) {
      local_274 = defragmentPage(local_148[0],-1);
      copyNodeContent(pMVar44,pMVar31,(int *)&local_274);
      uVar25 = local_248;
      pCur = local_250;
      pMVar29 = local_258;
      if (local_274 == 0) {
        local_274 = freePage2(pMVar44->pBt,pMVar44,pMVar44->pgno);
      }
    }
    else if (((0 < (int)local_270) && (local_210->autoVacuum != '\0')) && ((char)local_160 == '\0'))
    {
      local_260 = (ulong)local_270 & 0xffffffff;
      uVar28 = 0;
      do {
        uVar32 = *(uint *)(local_148[uVar28]->aData + 8);
        ptrmapPut(pBVar7,uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                         uVar32 << 0x18,'\x05',local_148[uVar28]->pgno,(int *)&local_274);
        uVar28 = uVar28 + 1;
      } while (local_260 != uVar28);
    }
    uVar28 = local_218;
    iVar27 = (int)local_270;
    iVar36 = (int)local_110;
    PVar18 = local_274;
    pMVar31 = local_270;
    if (iVar27 <= iVar36) {
      lVar38 = 0;
      do {
        if (PVar18 == 0) {
          pMVar31 = (MemPage *)(&local_1d8)[uVar28 + lVar38];
          PVar18 = freePage2(pMVar31->pBt,pMVar31,pMVar31->pgno);
        }
        lVar38 = lVar38 + 1;
        pMVar31 = local_270;
      } while ((iVar36 - iVar27) + 1 != (int)lVar38);
    }
  }
  else {
    if (0 < (int)(uint)local_240) {
      local_268 = (u16 *)CONCAT44(local_268._4_4_,(uint)((int)local_230 == 0));
      local_240 = (ulong)(int)local_210->usableSize;
      uVar37 = (uint)local_148[0]->nCell + (uint)local_148[0]->nOverflow;
      puVar42 = (uint *)local_148[0]->aData;
      uVar28 = 0;
      pMVar44 = (MemPage *)0x0;
      iVar27 = 0;
      pMVar29 = local_148[0];
      uVar25 = local_170;
      do {
        if (uVar28 == uVar37) {
          uVar32 = (int)pMVar44 + 1;
          ppMVar19 = (MemPage **)&local_1d8;
          if ((int)uVar32 < (int)local_270) {
            ppMVar19 = local_148;
          }
          pMVar31 = ppMVar19[(long)(int)pMVar44 + 1];
          uVar37 = uVar37 + (int)local_268 + (uint)pMVar31->nCell + (uint)pMVar31->nOverflow;
          puVar42 = (uint *)pMVar31->aData;
          pMVar44 = (MemPage *)(ulong)uVar32;
        }
        pCell = *(uint **)((u16 *)(local_1f8._16_8_ + 0x1a) + uVar28 * 4 + -0xd);
        iVar36 = iVar27;
        if (uVar28 == local_1b8[iVar27]) {
          iVar36 = iVar27 + 1;
          pMVar29 = local_148[(long)iVar27 + 1];
          if ((int)local_230 != 0) goto LAB_0013976a;
          iVar17 = 0x35;
          iVar27 = iVar36;
        }
        else {
LAB_0013976a:
          if (((((int)local_270 <= (int)pMVar44) || (pMVar29->pgno != aPStack_68[(int)pMVar44])) ||
              (pCell < puVar42)) ||
             (iVar17 = 0, iVar27 = iVar36, (uint *)((long)puVar42 + local_240) <= pCell)) {
            if ((char)local_160 == '\0') {
              local_238 = (MemPage *)CONCAT44(local_238._4_4_,iVar36);
              uVar32 = *pCell;
              ptrmapPut(local_210,
                        uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                        uVar32 << 0x18,'\x05',pMVar29->pgno,(int *)&local_274);
              uVar25 = local_170;
              iVar36 = (int)local_238;
            }
            uVar15 = *(u16 *)(local_1f8._24_8_ + uVar28 * 2);
            if (uVar15 == 0) {
              local_238 = pMVar44;
              uVar15 = computeCellSize((CellArray *)local_1f8,(int)uVar28);
              uVar25 = local_170;
              pMVar44 = local_238;
            }
            if (pMVar29->minLocal < uVar15) {
              ptrmapPutOvflPtr(pMVar29,(u8 *)pCell,(int *)&local_274);
              uVar25 = local_170;
            }
            iVar17 = (uint)(local_274 != 0) << 2;
            iVar27 = iVar36;
          }
        }
        uVar32 = (uint)uVar25;
        if ((iVar17 != 0x35) && (iVar17 != 0)) goto LAB_00139870;
        uVar28 = uVar28 + 1;
      } while ((long)uVar28 < (long)(int)local_1f8._0_4_);
    }
    iVar17 = 0;
LAB_00139870:
    PVar16 = (Pgno)pMVar44;
    PVar18 = local_274;
    pMVar29 = local_258;
    pCur = local_250;
    if (iVar17 == 0) goto LAB_00139896;
joined_r0x00139bc8:
    local_274 = PVar18;
    uVar25 = local_248;
    PVar18 = local_274;
    pMVar31 = local_270;
    local_258 = pMVar29;
    local_250 = pCur;
    if (iVar17 != 4) goto LAB_001385b6;
  }
LAB_00138551:
  local_270 = pMVar31;
  local_274 = PVar18;
  if ((MemPage *)local_1f8._16_8_ != (MemPage *)0x0) {
    sqlite3_free((void *)local_1f8._16_8_);
  }
  pMVar31 = local_270;
  uVar28 = 0;
  do {
    if ((&local_1d8)[uVar28] != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)((&local_1d8)[uVar28] + 0x70));
    }
    uVar28 = uVar28 + 1;
  } while (uVar25 != uVar28);
  PVar16 = local_274;
  if (0 < (int)pMVar31) {
    uVar25 = 0;
    do {
      if (local_148[uVar25] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_148[uVar25]->pDbPage);
      }
      uVar25 = uVar25 + 1;
      PVar16 = local_274;
    } while (((ulong)pMVar31 & 0xffffffff) != uVar25);
  }
LAB_001385b6:
  if (local_150 != (void *)0x0) {
    pcache1Free(local_150);
  }
  local_150 = local_168;
LAB_001385d8:
  pMVar29->nOverflow = '\0';
  if (pMVar29 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar29->pDbPage);
  }
  cVar12 = pCur->iPage + -1;
  pCur->iPage = cVar12;
  ppMVar19 = local_88 + cVar12;
LAB_00138607:
  pCur->pPage = *ppMVar19;
  bVar45 = true;
LAB_00138613:
  if ((!bVar45) || (PVar16 != 0)) {
    if (local_150 != (void *)0x0) {
      pcache1Free(local_150);
    }
    return PVar16;
  }
  goto LAB_00138180;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}